

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_encode.cpp
# Opt level: O0

void __thiscall
ktx::CommandEncode::OptionsEncode::process
          (OptionsEncode *this,Options *param_2,ParseResult *args,Reporter *report)

{
  bool bVar1;
  OptionValue *pOVar2;
  size_t sVar3;
  ParseResult *this_00;
  string *option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  VkFormat *pVVar5;
  char (*in_RDX) [51];
  VkFormat *in_RDI;
  optional<VkFormat> parsedVkFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> formatStr;
  string *in_stack_fffffffffffffe88;
  ParseResult *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb0;
  char (*in_stack_fffffffffffffec0) [51];
  Reporter *in_stack_fffffffffffffec8;
  allocator<char> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  byte bVar6;
  undefined1 uVar7;
  allocator<char> local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [40];
  char (*local_18) [51];
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (allocator<char> *)in_stack_fffffffffffffe90);
  pOVar2 = cxxopts::ParseResult::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  sVar3 = cxxopts::OptionValue::count(pOVar2);
  bVar6 = false;
  if (sVar3 != 0) {
    in_stack_fffffffffffffed0 = &local_79;
    in_stack_fffffffffffffec0 = local_18;
    in_stack_fffffffffffffec8 = (Reporter *)kFormat;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (allocator<char> *)in_stack_fffffffffffffe90);
    local_7b = 1;
    pOVar2 = cxxopts::ParseResult::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    sVar3 = cxxopts::OptionValue::count(pOVar2);
    bVar6 = sVar3 != 0;
  }
  uVar7 = bVar6;
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if ((bVar6 & 1) != 0) {
    Reporter::fatal_usage<char_const(&)[51]>(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)kFormat;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar4,*local_18,(allocator<char> *)in_stack_fffffffffffffe90);
  this_00 = (ParseResult *)
            cxxopts::ParseResult::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  option = (string *)cxxopts::OptionValue::count((OptionValue *)this_00);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (option != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar4,*local_18,(allocator<char> *)this_00);
    pOVar2 = cxxopts::ParseResult::operator[](this_00,option);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>
                       ((OptionValue *)CONCAT17(bVar6,in_stack_fffffffffffffeb0));
    std::__cxx11::string::string(local_c8,(string *)pbVar4);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    parseVkFormat((string *)pOVar2);
    bVar1 = std::optional::operator_cast_to_bool((optional<VkFormat> *)0x25e9bf);
    if (!bVar1) {
      Reporter::fatal_usage<char_const(&)[54],std::__cxx11::string_const&>
                ((Reporter *)CONCAT17(uVar7,in_stack_fffffffffffffed8),
                 (char (*) [54])in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->commandName);
    }
    pVVar5 = std::optional<VkFormat>::operator*((optional<VkFormat> *)0x25eaa9);
    *in_RDI = *pVVar5;
    bVar1 = isFormatAstc(*in_RDI);
    if (!bVar1) {
      Reporter::fatal_usage<char_const(&)[48]>
                (in_stack_fffffffffffffec8,(char (*) [48])in_stack_fffffffffffffec0);
    }
    std::__cxx11::string::~string(local_c8);
  }
  return;
}

Assistant:

void CommandEncode::OptionsEncode::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args[kCodec].count() && args[kFormat].count())
        report.fatal_usage("Format and codec can't be both specified together.");

    if (args[kFormat].count()) {
        const auto formatStr = args[kFormat].as<std::string>();
        const auto parsedVkFormat = parseVkFormat(formatStr);
        if (!parsedVkFormat)
            report.fatal_usage("The requested format is invalid or unsupported: \"{}\".", formatStr);

        vkFormat = *parsedVkFormat;

        if (!isFormatAstc(vkFormat)) {
            report.fatal_usage("Optional option 'format' is not an ASTC format.");
        }
    }
}